

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

void oSortDependencies(Abc_Ntk_t *pNtk,Vec_Int_t **oDep,int *iGroup)

{
  Vec_Int_t *p;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *iGroupList;
  Vec_Int_t *temp;
  int local_28;
  int k;
  int j;
  int i;
  int *iGroup_local;
  Vec_Int_t **oDep_local;
  Abc_Ntk_t *pNtk_local;
  
  p_00 = Vec_IntAlloc(10);
  for (k = 0; iVar1 = Abc_NtkPoNum(pNtk), k < iVar1; k = k + 1) {
    iVar1 = Vec_IntSize(oDep[k]);
    if (iVar1 != 1) {
      iVar1 = Vec_IntSize(oDep[k]);
      p_01 = Vec_IntAlloc(iVar1);
      for (local_28 = 0; iVar1 = Vec_IntSize(oDep[k]), local_28 < iVar1; local_28 = local_28 + 1) {
        iVar1 = Vec_IntEntry(oDep[k],local_28);
        Vec_IntPushUniqueOrder(p_00,iGroup[iVar1]);
      }
      for (local_28 = 0; iVar1 = Vec_IntSize(p_00), local_28 < iVar1; local_28 = local_28 + 1) {
        for (temp._4_4_ = 0; iVar1 = Vec_IntSize(oDep[k]), temp._4_4_ < iVar1;
            temp._4_4_ = temp._4_4_ + 1) {
          iVar1 = Vec_IntEntry(oDep[k],temp._4_4_);
          iVar1 = iGroup[iVar1];
          iVar2 = Vec_IntEntry(p_00,local_28);
          if (iVar1 == iVar2) {
            iVar1 = Vec_IntEntry(oDep[k],temp._4_4_);
            Vec_IntPush(p_01,iVar1);
            p = oDep[k];
            iVar1 = Vec_IntEntry(oDep[k],temp._4_4_);
            Vec_IntRemove(p,iVar1);
            temp._4_4_ = temp._4_4_ + -1;
          }
        }
      }
      Vec_IntFree(oDep[k]);
      oDep[k] = p_01;
      Vec_IntClear(p_00);
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void oSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** oDep, int* iGroup)
{
    int i, j, k;    
    Vec_Int_t * temp;
    Vec_Int_t * iGroupList;    
    
    iGroupList = Vec_IntAlloc( 10 );

    for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
    {
        if(Vec_IntSize(oDep[i]) == 1)
            continue;    
        
        temp = Vec_IntAlloc( Vec_IntSize(oDep[i]) );

        for(j = 0; j < Vec_IntSize(oDep[i]); j++)
            Vec_IntPushUniqueOrder(iGroupList, iGroup[Vec_IntEntry(oDep[i], j)]);        

        for(j = 0; j < Vec_IntSize(iGroupList); j++)
        {
            for(k = 0; k < Vec_IntSize(oDep[i]); k++)
                if(iGroup[Vec_IntEntry(oDep[i], k)] == Vec_IntEntry(iGroupList, j))
                {
                    Vec_IntPush( temp, Vec_IntEntry(oDep[i], k) );
                    Vec_IntRemove( oDep[i], Vec_IntEntry(oDep[i], k) );
                    k--;
                }
        }

        Vec_IntFree( oDep[i] );
        oDep[i] = temp;
        Vec_IntClear( iGroupList );

        /*printf("Output %d: ", i);
        for(j = 0; j < Vec_IntSize(oDep[i]); j++)
            printf("%d ", Vec_IntEntry(oDep[i], j));
        printf("\n");*/
    }
    
    Vec_IntFree( iGroupList );
}